

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slider.cpp
# Opt level: O1

bool __thiscall ftxui::SliderBase<int>::OnEvent(SliderBase<int> *this,Event *event)

{
  pointer pcVar1;
  size_t sVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int *piVar6;
  _Alloc_hider _Var7;
  undefined1 local_128 [24];
  _Alloc_hider local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  ScreenInteractive *local_f0;
  undefined1 local_e8 [24];
  _Alloc_hider local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  ScreenInteractive *local_b0;
  Event local_a8;
  Event local_68;
  
  if (event->type_ == Mouse) {
    local_e8._16_8_ = *(undefined8 *)((long)&event->field_1 + 0xc);
    local_e8._0_4_ = event->type_;
    local_e8._4_4_ = (event->field_1).mouse_.button;
    local_e8._8_4_ = (event->field_1).mouse_.motion;
    local_e8._12_4_ = *(undefined4 *)((long)&event->field_1 + 8);
    pcVar1 = (event->input_)._M_dataplus._M_p;
    local_d0._M_p = (pointer)&local_c0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d0,pcVar1,pcVar1 + (event->input_)._M_string_length);
    local_b0 = event->screen_;
    bVar3 = OnMouseEvent(this,(Event *)local_e8);
    local_100._M_allocated_capacity = local_c0._M_allocated_capacity;
    _Var7._M_p = local_d0._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_p == &local_c0) {
      return bVar3;
    }
LAB_00149c2e:
    operator_delete(_Var7._M_p,local_100._M_allocated_capacity + 1);
  }
  else {
    bVar4 = Event::operator==(event,(Event *)Event::ArrowLeft);
    bVar3 = true;
    if (!bVar4) {
      Event::Character(&local_68,'h');
      sVar2 = (event->input_)._M_string_length;
      if (sVar2 == local_68.input_._M_string_length) {
        if (sVar2 != 0) {
          iVar5 = bcmp((event->input_)._M_dataplus._M_p,local_68.input_._M_dataplus._M_p,sVar2);
          bVar3 = iVar5 == 0;
        }
      }
      else {
        bVar3 = false;
      }
    }
    if ((!bVar4) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68.input_._M_dataplus._M_p != &local_68.input_.field_2)) {
      operator_delete(local_68.input_._M_dataplus._M_p,
                      local_68.input_.field_2._M_allocated_capacity + 1);
    }
    if (bVar3) {
      piVar6 = this->value_;
      iVar5 = *piVar6 - this->increment_;
      *piVar6 = iVar5;
      if (iVar5 <= this->min_) {
        iVar5 = this->min_;
      }
    }
    else {
      bVar4 = Event::operator==(event,(Event *)Event::ArrowRight);
      bVar3 = true;
      if (!bVar4) {
        Event::Character(&local_a8,'l');
        sVar2 = (event->input_)._M_string_length;
        if (sVar2 == local_a8.input_._M_string_length) {
          if (sVar2 != 0) {
            iVar5 = bcmp((event->input_)._M_dataplus._M_p,local_a8.input_._M_dataplus._M_p,sVar2);
            bVar3 = iVar5 == 0;
          }
        }
        else {
          bVar3 = false;
        }
      }
      if ((!bVar4) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8.input_._M_dataplus._M_p != &local_a8.input_.field_2)) {
        operator_delete(local_a8.input_._M_dataplus._M_p,
                        local_a8.input_.field_2._M_allocated_capacity + 1);
      }
      if (!bVar3) {
        local_128._16_8_ = *(undefined8 *)((long)&event->field_1 + 0xc);
        local_128._0_4_ = event->type_;
        local_128._4_4_ = (event->field_1).mouse_.button;
        local_128._8_4_ = (event->field_1).mouse_.motion;
        local_128._12_4_ = *(undefined4 *)((long)&event->field_1 + 8);
        pcVar1 = (event->input_)._M_dataplus._M_p;
        local_110._M_p = (pointer)&local_100;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_110,pcVar1,pcVar1 + (event->input_)._M_string_length);
        local_f0 = event->screen_;
        bVar3 = ComponentBase::OnEvent(&this->super_ComponentBase,(Event *)local_128);
        _Var7._M_p = local_110._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_p == &local_100) {
          return bVar3;
        }
        goto LAB_00149c2e;
      }
      piVar6 = this->value_;
      iVar5 = *piVar6 + this->increment_;
      *piVar6 = iVar5;
      if (this->max_ < iVar5) {
        iVar5 = this->max_;
      }
    }
    *piVar6 = iVar5;
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool OnEvent(Event event) final {
    if (event.is_mouse())
      return OnMouseEvent(event);

    if (event == Event::ArrowLeft || event == Event::Character('h')) {
      *value_ -= increment_;
      *value_ = std::max(*value_, min_);
      return true;
    }

    if (event == Event::ArrowRight || event == Event::Character('l')) {
      *value_ += increment_;
      *value_ = std::min(*value_, max_);
      return true;
    }

    return ComponentBase::OnEvent(event);
  }